

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SubInt64(i64 *pA,i64 iB)

{
  long in_RSI;
  i64 *in_RDI;
  undefined4 local_4;
  
  if (in_RSI == -0x8000000000000000) {
    if (*in_RDI < 0) {
      *in_RDI = *in_RDI + -0x8000000000000000;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = sqlite3AddInt64(in_RDI,-in_RSI);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3SubInt64(i64 *pA, i64 iB){
#if GCC_VERSION>=5004000 && !defined(__INTEL_COMPILER)
  return __builtin_sub_overflow(*pA, iB, pA);
#else
  testcase( iB==SMALLEST_INT64+1 );
  if( iB==SMALLEST_INT64 ){
    testcase( (*pA)==(-1) ); testcase( (*pA)==0 );
    if( (*pA)>=0 ) return 1;
    *pA -= iB;
    return 0;
  }else{
    return sqlite3AddInt64(pA, -iB);
  }
#endif
}